

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

ExpressionValue * __thiscall
ExpressionInternal::executeFunctionCall
          (ExpressionValue *__return_storage_ptr__,ExpressionInternal *this)

{
  undefined8 uVar1;
  bool bVar2;
  ExpressionFunctionHandler *this_00;
  ExpressionFunctionHandle *pEVar3;
  size_t sVar4;
  size_type sVar5;
  Identifier *in_RCX;
  optional<ExpressionFunctionHandle> oVar6;
  size_t local_50;
  size_type local_48;
  size_t local_40;
  size_type local_38;
  _Storage<ExpressionFunctionHandle,_true> local_30;
  optional<ExpressionFunctionHandle> handle;
  Identifier *functionName;
  ExpressionInternal *this_local;
  
  handle.super__Optional_base<ExpressionFunctionHandle,_true,_true>._M_payload.
  super__Optional_payload_base<ExpressionFunctionHandle>._8_8_ = valueAs<Identifier>(this);
  this_00 = ExpressionFunctionHandler::instance();
  oVar6 = ExpressionFunctionHandler::find
                    (this_00,(Identifier *)
                             handle.super__Optional_base<ExpressionFunctionHandle,_true,_true>.
                             _M_payload.super__Optional_payload_base<ExpressionFunctionHandle>._8_8_
                    );
  local_30 = oVar6.super__Optional_base<ExpressionFunctionHandle,_true,_true>._M_payload.
             super__Optional_payload_base<ExpressionFunctionHandle>._M_payload;
  handle.super__Optional_base<ExpressionFunctionHandle,_true,_true>._M_payload.
  super__Optional_payload_base<ExpressionFunctionHandle>._M_payload._0_1_ =
       oVar6.super__Optional_base<ExpressionFunctionHandle,_true,_true>._M_payload.
       super__Optional_payload_base<ExpressionFunctionHandle>._M_engaged;
  bVar2 = std::optional::operator_cast_to_bool((optional *)&local_30._M_value);
  if (bVar2) {
    pEVar3 = std::optional<ExpressionFunctionHandle>::operator->
                       ((optional<ExpressionFunctionHandle> *)&local_30._M_value);
    sVar4 = ExpressionFunctionHandle::minParams(pEVar3);
    sVar5 = std::
            vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
            ::size(&this->children);
    uVar1 = handle.super__Optional_base<ExpressionFunctionHandle,_true,_true>._M_payload.
            super__Optional_payload_base<ExpressionFunctionHandle>._8_8_;
    if (sVar5 < sVar4) {
      local_38 = std::
                 vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                 ::size(&this->children);
      pEVar3 = std::optional<ExpressionFunctionHandle>::operator->
                         ((optional<ExpressionFunctionHandle> *)&local_30._M_value);
      local_40 = ExpressionFunctionHandle::minParams(pEVar3);
      Logger::queueError<Identifier,unsigned_long,unsigned_long>
                (Error,"Not enough parameters for \"%s\" (%d<%d)",(Identifier *)uVar1,&local_38,
                 &local_40);
      ExpressionValue::ExpressionValue(__return_storage_ptr__);
    }
    else {
      pEVar3 = std::optional<ExpressionFunctionHandle>::operator->
                         ((optional<ExpressionFunctionHandle> *)&local_30._M_value);
      sVar4 = ExpressionFunctionHandle::maxParams(pEVar3);
      sVar5 = std::
              vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
              ::size(&this->children);
      uVar1 = handle.super__Optional_base<ExpressionFunctionHandle,_true,_true>._M_payload.
              super__Optional_payload_base<ExpressionFunctionHandle>._8_8_;
      if (sVar4 < sVar5) {
        local_48 = std::
                   vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                   ::size(&this->children);
        pEVar3 = std::optional<ExpressionFunctionHandle>::operator->
                           ((optional<ExpressionFunctionHandle> *)&local_30._M_value);
        local_50 = ExpressionFunctionHandle::maxParams(pEVar3);
        Logger::queueError<Identifier,unsigned_long,unsigned_long>
                  (Error,"Too many parameters for \"%s\" (%d>%d)",(Identifier *)uVar1,&local_48,
                   &local_50);
        ExpressionValue::ExpressionValue(__return_storage_ptr__);
      }
      else {
        pEVar3 = std::optional<ExpressionFunctionHandle>::operator->
                           ((optional<ExpressionFunctionHandle> *)&local_30._M_value);
        ExpressionFunctionHandle::execute(__return_storage_ptr__,pEVar3,&this->children);
      }
    }
  }
  else {
    Logger::queueError<Identifier>
              ((Logger *)0x1,0x229b67,
               (char *)handle.super__Optional_base<ExpressionFunctionHandle,_true,_true>._M_payload.
                       super__Optional_payload_base<ExpressionFunctionHandle>._8_8_,in_RCX);
    ExpressionValue::ExpressionValue(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue ExpressionInternal::executeFunctionCall()
{
	const auto &functionName = valueAs<Identifier>();

	auto handle = ExpressionFunctionHandler::instance().find(functionName);
	if (!handle)
	{
		Logger::queueError(Logger::Error, "Unknown function \"%s\"", functionName);
		return {};
	}

	if (handle->minParams() > children.size())
	{
		Logger::queueError(Logger::Error, "Not enough parameters for \"%s\" (%d<%d)", functionName, children.size(), handle->minParams());
		return {};
	}

	if (handle->maxParams() < children.size())
	{
		Logger::queueError(Logger::Error, "Too many parameters for \"%s\" (%d>%d)", functionName, children.size(), handle->maxParams());
		return {};
	}

	return handle->execute(children);
}